

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

pair<const_char_*,_unsigned_int> google::protobuf::internal::VarintParseSlow32(char *p,uint32 res)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  pair<const_char_*,_unsigned_int> pVar5;
  
  pcVar1 = p + 3;
  lVar2 = -0x15;
  do {
    res = ((byte)pcVar1[-1] - 1 << ((char)lVar2 + 0x23U & 0x1f)) + res;
    if (-1 < pcVar1[-1]) goto LAB_0027ee21;
    pcVar1 = pcVar1 + 1;
    lVar2 = lVar2 + 7;
  } while (lVar2 != 0);
  lVar2 = 5;
  uVar3 = 0;
  pcVar4 = p + 6;
  do {
    pcVar1 = pcVar4;
    if (-1 < pcVar1[-1]) goto LAB_0027ee21;
    pcVar4 = pcVar1 + 1;
    pcVar1 = (char *)0x0;
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
LAB_0027ee23:
  pVar5._8_8_ = uVar3;
  pVar5.first = pcVar1;
  return pVar5;
LAB_0027ee21:
  uVar3 = (ulong)res;
  goto LAB_0027ee23;
}

Assistant:

std::pair<const char*, uint32> VarintParseSlow32(const char* p, uint32 res) {
  for (std::uint32_t i = 2; i < 5; i++) {
    uint32 byte = static_cast<uint8>(p[i]);
    res += (byte - 1) << (7 * i);
    if (PROTOBUF_PREDICT_TRUE(byte < 128)) {
      return {p + i + 1, res};
    }
  }
  // Accept >5 bytes
  for (std::uint32_t i = 5; i < 10; i++) {
    uint32 byte = static_cast<uint8>(p[i]);
    if (PROTOBUF_PREDICT_TRUE(byte < 128)) {
      return {p + i + 1, res};
    }
  }
  return {nullptr, 0};
}